

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clparser_test.cc
# Opt level: O2

void __thiscall CLParserTestFilterInputFilename::Run(CLParserTestFilterInputFilename *this)

{
  Test *pTVar1;
  bool bVar2;
  allocator<char> local_b9;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  pTVar1 = g_current_test;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"foobar.cc",&local_b9);
  bVar2 = CLParser::FilterInputFilename(&local_38);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/clparser_test.cc"
                     ,0x25,"CLParser::FilterInputFilename(\"foobar.cc\")");
  std::__cxx11::string::~string((string *)&local_38);
  pTVar1 = g_current_test;
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"foo bar.cc",&local_b9);
    bVar2 = CLParser::FilterInputFilename(&local_58);
    bVar2 = testing::Test::Check
                      (pTVar1,bVar2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/clparser_test.cc"
                       ,0x26,"CLParser::FilterInputFilename(\"foo bar.cc\")");
    std::__cxx11::string::~string((string *)&local_58);
    pTVar1 = g_current_test;
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"baz.c",&local_b9);
      bVar2 = CLParser::FilterInputFilename(&local_78);
      bVar2 = testing::Test::Check
                        (pTVar1,bVar2,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/clparser_test.cc"
                         ,0x27,"CLParser::FilterInputFilename(\"baz.c\")");
      std::__cxx11::string::~string((string *)&local_78);
      pTVar1 = g_current_test;
      if (bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,"FOOBAR.CC",&local_b9);
        bVar2 = CLParser::FilterInputFilename(&local_98);
        bVar2 = testing::Test::Check
                          (pTVar1,bVar2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/clparser_test.cc"
                           ,0x28,"CLParser::FilterInputFilename(\"FOOBAR.CC\")");
        std::__cxx11::string::~string((string *)&local_98);
        pTVar1 = g_current_test;
        if (bVar2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b8,
                     "src\\cl_helper.cc(166) : fatal error C1075: end of file found ...",&local_b9);
          bVar2 = CLParser::FilterInputFilename(&local_b8);
          bVar2 = testing::Test::Check
                            (pTVar1,!bVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/clparser_test.cc"
                             ,0x2c,
                             "CLParser::FilterInputFilename( \"src\\\\cl_helper.cc(166) : fatal error C1075: end \" \"of file found ...\")"
                            );
          std::__cxx11::string::~string((string *)&local_b8);
          if (bVar2) {
            return;
          }
        }
      }
    }
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  return;
}

Assistant:

TEST(CLParserTest, FilterInputFilename) {
  ASSERT_TRUE(CLParser::FilterInputFilename("foobar.cc"));
  ASSERT_TRUE(CLParser::FilterInputFilename("foo bar.cc"));
  ASSERT_TRUE(CLParser::FilterInputFilename("baz.c"));
  ASSERT_TRUE(CLParser::FilterInputFilename("FOOBAR.CC"));

  ASSERT_FALSE(CLParser::FilterInputFilename(
                   "src\\cl_helper.cc(166) : fatal error C1075: end "
                   "of file found ..."));
}